

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O2

lws_vhost * lws_create_vhost(lws_context *context,lws_context_creation_info *info)

{
  lws_retry_bo_t **__dest;
  lws_lifecycle_t *lc;
  lws_callback_function *plVar1;
  lws_role_ops *plVar2;
  lws_vhost *plVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  lws_dll2 *plVar6;
  size_t sVar7;
  lws_dll2 *plVar8;
  void *pvVar9;
  long lVar10;
  lws_vhost **pplVar11;
  int iVar12;
  size_t sVar13;
  lws *vhost;
  lws_log_cx_t *plVar14;
  long lVar15;
  lws_dll2 *plVar16;
  lws_dll2_owner *plVar17;
  char *src;
  lws_retry_bo_t *plVar18;
  lws_callback_function **pplVar19;
  ulong uVar20;
  long lVar21;
  lws_dll2_owner *plVar22;
  lws_vhost **pplVar23;
  lws_role_ops **ppxx;
  lws_role_ops **pplVar24;
  ulong uVar25;
  char *pcVar26;
  lws_protocols *plVar27;
  uint uVar28;
  lws_http_mount *plVar29;
  undefined4 uVar30;
  char buf [96];
  
  plVar27 = info->protocols;
  pcVar26 = "default";
  if (info->vhost_name != (char *)0x0) {
    pcVar26 = info->vhost_name;
  }
  sVar13 = strlen(pcVar26);
  vhost = (lws *)lws_zalloc(sVar13 + 0x371,"lws_create_vhost");
  if (vhost != (lws *)0x0) {
    plVar14 = info->log_cx;
    if (plVar14 == (lws_log_cx_t *)0x0) {
      plVar14 = &log_cx;
    }
    *(lws_log_cx_t **)&(vhost->sul_timeout).latency_us = plVar14;
    __dest = &vhost->retry_policy;
    (vhost->sul_connect_timeout).list.next = (lws_dll2 *)__dest;
    sVar13 = strlen(pcVar26);
    memcpy(__dest,pcVar26,sVar13 + 1);
    if ((plVar27 == (lws_protocols *)0x0) &&
       (plVar27 = (lws_protocols *)0x0, info->pprotocols == (lws_protocols **)0x0)) {
      plVar27 = protocols_dummy;
    }
    (vhost->sul_validity).list.next = (lws_dll2 *)context;
    iVar12 = lws_snprintf(buf,0x5f,"%s",__dest);
    pcVar26 = buf + iVar12;
    if (info->iface != (char *)0x0) {
      iVar12 = lws_snprintf(pcVar26,0x5f - (long)iVar12,"|%s");
      pcVar26 = pcVar26 + iVar12;
    }
    uVar28 = info->port;
    uVar25 = (ulong)uVar28;
    if ((short)uVar28 == 0 && uVar28 != 0) {
      lws_snprintf(pcVar26,(size_t)(buf + (0x5f - (long)pcVar26)),"|%u",uVar25);
      uVar25 = (ulong)(uint)info->port;
    }
    lc = (lws_lifecycle_t *)((vhost->lc).gutag + 0x30);
    pcVar26 = "";
    if (info->iface != (char *)0x0) {
      pcVar26 = info->iface;
    }
    __lws_lc_tag(context,context->lcg + 1,lc,"%s|%s|%d",buf,pcVar26,uVar25);
    *(char **)((vhost->lc).gutag + 0x20) = info->error_document_404;
    if ((info->options & 0x400000) != 0) {
      _lws_log_cx(*(lws_log_cx_t **)&(vhost->sul_timeout).latency_us,lws_log_prepend_vhost,vhost,8,
                  "lws_create_vhost","set to only support RAW");
    }
    (vhost->sul_connect_timeout).list.owner = (lws_dll2_owner *)info->iface;
    (vhost->sa46_peer).sa4.sin_addr.s_addr = info->bind_iface;
    uVar28 = 0x14;
    if (info->connect_timeout_secs != 0) {
      uVar28 = info->connect_timeout_secs;
    }
    *(uint *)&vhost->sibling_list = uVar28;
    plVar18 = &context->default_retry;
    if (info->retry_and_idle_policy != (lws_retry_bo_t *)0x0) {
      plVar18 = info->retry_and_idle_policy;
    }
    (vhost->sul_validity).us = (lws_usec_t)plVar18;
    if (plVar27 == (lws_protocols *)0x0) {
      lVar21 = -1;
      do {
        lVar15 = lVar21 + 1;
        lVar10 = lVar21 + 1;
        lVar21 = lVar15;
      } while (info->pprotocols[lVar10] != (lws_protocols *)0x0);
    }
    else {
      lVar15 = -1;
      pplVar19 = &plVar27->callback;
      do {
        lVar15 = lVar15 + 1;
        plVar1 = *pplVar19;
        pplVar19 = pplVar19 + 7;
      } while (plVar1 != (lws_callback_function *)0x0);
    }
    *(int *)((long)&vhost->sa46_peer + 8) = (int)lVar15;
    (vhost->sul_validity).list.prev = (lws_dll2 *)info->options;
    (vhost->same_vh_protocol).next = (lws_dll2 *)info->pvo;
    (vhost->same_vh_protocol).owner = (lws_dll2_owner *)info->headers;
    *(void **)((long)&vhost->sa46_local + 8) = info->user;
    plVar16 = (lws_dll2 *)info->finalize_arg;
    (vhost->dll_buflist).prev = (lws_dll2 *)info->finalize;
    (vhost->dll_buflist).next = plVar16;
    uVar30 = *(undefined4 *)((long)&info->listen_accept_role + 4);
    uVar4 = *(undefined4 *)&info->listen_accept_protocol;
    uVar5 = *(undefined4 *)((long)&info->listen_accept_protocol + 4);
    *(undefined4 *)&(vhost->sul_connect_timeout).us = *(undefined4 *)&info->listen_accept_role;
    *(undefined4 *)((long)&(vhost->sul_connect_timeout).us + 4) = uVar30;
    *(undefined4 *)&(vhost->sul_connect_timeout).cb = uVar4;
    *(undefined4 *)((long)&(vhost->sul_connect_timeout).cb + 4) = uVar5;
    *(char **)&(vhost->sul_connect_timeout).latency_us = info->unix_socket_perms;
    *(int *)((long)&vhost->sibling_list + 4) = info->fo_listen_queue;
    pplVar24 = available_roles;
    do {
      uVar30 = (undefined4)(uVar25 >> 0x20);
      plVar2 = *pplVar24;
      if (plVar2 == (lws_role_ops *)0x0) {
        iVar12 = 5;
        if (info->keepalive_timeout != 0) {
          iVar12 = info->keepalive_timeout;
        }
        *(int *)&vhost->child_list = iVar12;
        uVar28 = 10;
        if (info->timeout_secs_ah_idle != 0) {
          uVar28 = info->timeout_secs_ah_idle;
        }
        *(uint *)((long)&vhost->child_list + 4) = uVar28;
        *(char **)&(vhost->dll2_cli_txn_queue_owner).count = info->alpn;
        *(int *)&vhost->sa46_local = info->ssl_info_event_mask;
        if (info->ecdh_curve != (char *)0x0) {
          lws_strncpy((char *)&vhost->speculative_connect_owner,info->ecdh_curve,0x10);
        }
        if (info->ssl_cert_filepath == (char *)0x0) {
          uVar28 = 0;
        }
        else {
          sVar13 = strlen(info->ssl_cert_filepath);
          uVar28 = (int)sVar13 + 1;
        }
        if (info->ssl_private_key_filepath != (char *)0x0) {
          sVar13 = strlen(info->ssl_private_key_filepath);
          uVar28 = uVar28 + (int)sVar13 + 1;
        }
        if (uVar28 != 0) {
          plVar16 = (lws_dll2 *)lws_realloc((void *)0x0,(ulong)uVar28,"vh paths");
          (vhost->speculative_list).next = plVar16;
          (vhost->speculative_list).owner = (lws_dll2_owner *)plVar16;
          pcVar26 = info->ssl_cert_filepath;
          if (pcVar26 != (char *)0x0) {
            sVar13 = strlen(pcVar26);
            memcpy(plVar16,pcVar26,(ulong)((int)sVar13 + 1));
            plVar16 = (lws_dll2 *)
                      ((long)&((vhost->speculative_list).owner)->tail + (long)(int)sVar13 + 1);
            (vhost->speculative_list).owner = (lws_dll2_owner *)plVar16;
          }
          pcVar26 = info->ssl_private_key_filepath;
          if (pcVar26 != (char *)0x0) {
            sVar13 = strlen(pcVar26);
            memcpy(plVar16,pcVar26,sVar13 + 1);
          }
        }
        plVar17 = (lws_dll2_owner *)
                  lws_zalloc((ulong)(*(int *)((long)&vhost->sa46_peer + 8) +
                                     (int)context->plugin_protocol_count + 1) * 0x38,
                             "vh plugin table");
        if (plVar17 == (lws_dll2_owner *)0x0) {
          _lws_log(1,"OOM\n");
          __lws_lc_untag((lws_context *)(vhost->sul_validity).list.next,lc);
          lws_realloc(vhost,0,"lws_free");
          return (lws_vhost *)0x0;
        }
        uVar28 = *(uint *)((long)&vhost->sa46_peer + 8);
        if (plVar27 == (lws_protocols *)0x0) {
          uVar20 = 0;
          plVar22 = plVar17;
          uVar25 = (ulong)uVar28;
          if ((int)uVar28 < 1) {
            uVar25 = uVar20;
          }
          for (; uVar25 != uVar20; uVar20 = uVar20 + 1) {
            plVar27 = info->pprotocols[uVar20];
            plVar22[2].tail = (lws_dll2 *)plVar27->tx_packet_size;
            plVar16 = (lws_dll2 *)plVar27->name;
            plVar6 = (lws_dll2 *)plVar27->callback;
            sVar7 = plVar27->per_session_data_size;
            plVar8 = (lws_dll2 *)plVar27->rx_buffer_size;
            pvVar9 = plVar27->user;
            plVar22[1].head = *(lws_dll2 **)&plVar27->id;
            *(void **)&plVar22[1].count = pvVar9;
            *(size_t *)&plVar22->count = sVar7;
            plVar22[1].tail = plVar8;
            plVar22->tail = plVar16;
            plVar22->head = plVar6;
            plVar22 = (lws_dll2_owner *)&plVar22[2].head;
          }
        }
        else {
          memcpy(plVar17,plVar27,(ulong)uVar28 * 0x38);
        }
        (vhost->dll_buflist).owner = plVar17;
        *(byte *)&vhost->seq = *(byte *)&vhost->seq | 1;
        plVar16 = (lws_dll2 *)
                  lws_zalloc((ulong)*(uint *)((long)&vhost->sa46_peer + 8) * 0x18,"same vh list");
        (vhost->vh_awaiting_socket).prev = plVar16;
        *(lws_http_mount **)((vhost->lc).gutag + 0x18) = info->mounts;
        if (((ulong)(vhost->sul_validity).list.prev & 0x4000) == 0) {
          if (info->port == -2) {
            builtin_strncpy(buf + 8,"ener)",6);
            builtin_strncpy(buf,"(no list",8);
          }
          else if (info->port == -1) {
            builtin_strncpy(buf,"(serving disabled)",0x13);
          }
          else {
            lws_snprintf(buf,0x60,"port %u");
          }
          plVar14 = *(lws_log_cx_t **)&(vhost->sul_timeout).latency_us;
          uVar25 = (ulong)*(uint *)((long)&vhost->sa46_peer + 8);
          plVar17 = (lws_dll2_owner *)buf;
          pcVar26 = "Creating Vhost \'%s\' %s, %d protocols, IPv6 %s";
          plVar16 = (vhost->sul_connect_timeout).list.next;
        }
        else {
          plVar14 = *(lws_log_cx_t **)&(vhost->sul_timeout).latency_us;
          plVar16 = (vhost->sul_connect_timeout).list.next;
          plVar17 = (vhost->sul_connect_timeout).list.owner;
          uVar25 = CONCAT44(uVar30,*(undefined4 *)((long)&vhost->sa46_peer + 8));
          pcVar26 = "Creating \'%s\' path \"%s\", %d protocols";
        }
        _lws_log_cx(plVar14,lws_log_prepend_vhost,vhost,8,"lws_create_vhost",pcVar26,plVar16,plVar17
                    ,uVar25);
        plVar29 = (lws_http_mount *)&info->mounts;
        while (plVar29 = plVar29->mount_next, plVar29 != (lws_http_mount *)0x0) {
          pcVar26 = plVar29->origin;
          if (pcVar26 == (char *)0x0) {
            pcVar26 = "none";
          }
          _lws_log_cx(*(lws_log_cx_t **)&(vhost->sul_timeout).latency_us,lws_log_prepend_vhost,vhost
                      ,8,"lws_create_vhost","   mounting %s%s to %s",
                      mount_protocols_rel +
                      *(int *)(mount_protocols_rel + (ulong)plVar29->origin_protocol * 4),pcVar26,
                      plVar29->mountpoint);
        }
        *(int *)&vhost->sa46_peer = info->port;
        (vhost->lc).gutag[0x28] = '\0';
        (vhost->lc).gutag[0x29] = '\0';
        (vhost->lc).gutag[0x2a] = '\0';
        (vhost->lc).gutag[0x2b] = '\0';
        *(undefined1 *)&(vhost->http).rx_content_remain = 0;
        pcVar26 = info->http_proxy_address;
        if (pcVar26 == (char *)0x0) {
          src = getenv("http_proxy");
          if (src == (char *)0x0) goto LAB_00123bf5;
          pcVar26 = buf;
          lws_strncpy(pcVar26,src,0x60);
        }
        else if (info->http_proxy_port != 0) {
          *(uint *)((vhost->lc).gutag + 0x28) = info->http_proxy_port;
        }
        lws_set_proxy((lws_vhost *)vhost,pcVar26);
LAB_00123bf5:
        *(int *)((long)&vhost->parent + 4) = info->ka_interval;
        *(undefined8 *)((long)&vhost->sa46_peer + 0xc) = *(undefined8 *)&info->ka_time;
        if (((ulong)(vhost->sul_validity).list.prev & 0x8000) != 0) {
          _lws_log_cx(*(lws_log_cx_t **)&(vhost->sul_timeout).latency_us,lws_log_prepend_vhost,vhost
                      ,4,"lws_create_vhost","   STS enabled");
        }
        iVar12 = lws_context_init_server_ssl(info,(lws_vhost *)vhost);
        if (iVar12 == 0) {
          iVar12 = lws_context_init_client_ssl(info,(lws_vhost *)vhost);
          if (iVar12 == 0) {
            iVar12 = _lws_vhost_init_server(info,(lws_vhost *)vhost);
            pplVar11 = &context->vhost_list;
            if (-1 < iVar12) {
              do {
                pplVar23 = pplVar11;
                plVar3 = *pplVar23;
                pplVar11 = &plVar3->vhost_next;
              } while (plVar3 != (lws_vhost *)0x0);
              *pplVar23 = (lws_vhost *)vhost;
              if ((context->field_0x7b7 & 0x40) != 0) {
                lws_protocol_init(context);
                return (lws_vhost *)vhost;
              }
              return (lws_vhost *)vhost;
            }
            pcVar26 = "init server failed\n";
          }
          else {
            pcVar26 = "lws_context_init_client_ssl failed";
          }
        }
        else {
          pcVar26 = "lws_context_init_server_ssl failed";
        }
        _lws_log_cx(*(lws_log_cx_t **)&(vhost->sul_timeout).latency_us,lws_log_prepend_vhost,vhost,1
                    ,"lws_create_vhost",pcVar26);
        lws_vhost_destroy((lws_vhost *)vhost);
        return (lws_vhost *)0x0;
      }
      pplVar24 = pplVar24 + 1;
    } while ((plVar2->rops_idx[1] < 0x10) ||
            (iVar12 = (*plVar2->rops_table[(plVar2->rops_idx[1] >> 4) - 1].check_upgrades)(vhost),
            iVar12 == 0));
  }
  return (lws_vhost *)0x0;
}

Assistant:

struct lws_vhost *
lws_create_vhost(struct lws_context *context,
		 const struct lws_context_creation_info *info)
{
	struct lws_vhost *vh, **vh1 = &context->vhost_list;
	const struct lws_http_mount *mounts;
	const struct lws_protocols *pcols = info->protocols;
#ifdef LWS_WITH_PLUGINS
	struct lws_plugin *plugin = context->plugin_list;
#endif
	struct lws_protocols *lwsp;
	int m, f = !info->pvo, fx = 0, abs_pcol_count = 0, sec_pcol_count = 0;
	const char *name = "default";
	char buf[96];
	char *p;
#if defined(LWS_WITH_SYS_ASYNC_DNS)
	extern struct lws_protocols lws_async_dns_protocol;
#endif
	int n;

	if (info->vhost_name)
		name = info->vhost_name;

	if (lws_fi(&info->fic, "vh_create_oom"))
		vh = NULL;
	else
		vh = lws_zalloc(sizeof(*vh) + strlen(name) + 1
#if defined(LWS_WITH_EVENT_LIBS)
			+ context->event_loop_ops->evlib_size_vh
#endif
			, __func__);
	if (!vh)
		goto early_bail;

	if (info->log_cx)
		vh->lc.log_cx = info->log_cx;
	else
		vh->lc.log_cx = &log_cx;

#if defined(LWS_WITH_EVENT_LIBS)
	vh->evlib_vh = (void *)&vh[1];
	vh->name = (const char *)vh->evlib_vh +
			context->event_loop_ops->evlib_size_vh;
#else
	vh->name = (const char *)&vh[1];
#endif
	memcpy((char *)vh->name, name, strlen(name) + 1);

#if LWS_MAX_SMP > 1
	lws_mutex_refcount_init(&vh->mr);
#endif

	if (!pcols && !info->pprotocols)
		pcols = &protocols_dummy[0];

	vh->context = context;
	{
		char *end = buf + sizeof(buf) - 1;
		p = buf;

		p += lws_snprintf(p, lws_ptr_diff_size_t(end, p), "%s", vh->name);
		if (info->iface)
			p += lws_snprintf(p, lws_ptr_diff_size_t(end, p), "|%s", info->iface);
		if (info->port && !(info->port & 0xffff))
			p += lws_snprintf(p, lws_ptr_diff_size_t(end, p), "|%u", info->port);
	}

	__lws_lc_tag(context, &context->lcg[LWSLCG_VHOST], &vh->lc, "%s|%s|%d",
		     buf, info->iface ? info->iface : "", info->port);

#if defined(LWS_WITH_SYS_FAULT_INJECTION)
	vh->fic.name = "vh";
	if (info->fic.fi_owner.count)
		/*
		 * This moves all the lws_fi_t from info->fi to the vhost fi,
		 * leaving it empty
		 */
		lws_fi_import(&vh->fic, &info->fic);

	lws_fi_inherit_copy(&vh->fic, &context->fic, "vh", vh->name);
	if (lws_fi(&vh->fic, "vh_create_oom"))
		goto bail;
#endif

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	vh->http.error_document_404 = info->error_document_404;
#endif

	if (lws_check_opt(info->options, LWS_SERVER_OPTION_ONLY_RAW))
		lwsl_vhost_info(vh, "set to only support RAW");

	vh->iface = info->iface;
#if !defined(LWS_PLAT_FREERTOS) && !defined(OPTEE_TA) && !defined(WIN32)
	vh->bind_iface = info->bind_iface;
#endif
#if defined(LWS_WITH_CLIENT)
	if (info->connect_timeout_secs)
		vh->connect_timeout_secs = (int)info->connect_timeout_secs;
	else
		vh->connect_timeout_secs = 20;
#endif
	/* apply the context default lws_retry */

	if (info->retry_and_idle_policy)
		vh->retry_policy = info->retry_and_idle_policy;
	else
		vh->retry_policy = &context->default_retry;

	/*
	 * let's figure out how many protocols the user is handing us, using the
	 * old or new way depending on what he gave us
	 */

	if (!pcols)
		for (vh->count_protocols = 0;
			info->pprotocols[vh->count_protocols];
			vh->count_protocols++)
			;
	else
		for (vh->count_protocols = 0;
			pcols[vh->count_protocols].callback;
			vh->count_protocols++)
				;

	vh->options			= info->options;
	vh->pvo				= info->pvo;
	vh->headers			= info->headers;
	vh->user			= info->user;
	vh->finalize			= info->finalize;
	vh->finalize_arg		= info->finalize_arg;
	vh->listen_accept_role		= info->listen_accept_role;
	vh->listen_accept_protocol	= info->listen_accept_protocol;
	vh->unix_socket_perms		= info->unix_socket_perms;
	vh->fo_listen_queue		= info->fo_listen_queue;

	LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar)
	if (lws_rops_fidx(ar, LWS_ROPS_init_vhost) &&
	    (lws_rops_func_fidx(ar, LWS_ROPS_init_vhost)).init_vhost(vh, info))
		return NULL;
	LWS_FOR_EVERY_AVAILABLE_ROLE_END;


	if (info->keepalive_timeout)
		vh->keepalive_timeout = info->keepalive_timeout;
	else
		vh->keepalive_timeout = 5;

	if (info->timeout_secs_ah_idle)
		vh->timeout_secs_ah_idle = (int)info->timeout_secs_ah_idle;
	else
		vh->timeout_secs_ah_idle = 10;

#if defined(LWS_WITH_TLS)

	vh->tls.alpn = info->alpn;
	vh->tls.ssl_info_event_mask = info->ssl_info_event_mask;

	if (info->ecdh_curve)
		lws_strncpy(vh->tls.ecdh_curve, info->ecdh_curve,
			    sizeof(vh->tls.ecdh_curve));

	/* carefully allocate and take a copy of cert + key paths if present */
	n = 0;
	if (info->ssl_cert_filepath)
		n += (int)strlen(info->ssl_cert_filepath) + 1;
	if (info->ssl_private_key_filepath)
		n += (int)strlen(info->ssl_private_key_filepath) + 1;

	if (n) {
		vh->tls.key_path = vh->tls.alloc_cert_path =
					lws_malloc((unsigned int)n, "vh paths");
		if (info->ssl_cert_filepath) {
			n = (int)strlen(info->ssl_cert_filepath) + 1;
			memcpy(vh->tls.alloc_cert_path,
			       info->ssl_cert_filepath, (unsigned int)n);
			vh->tls.key_path += n;
		}
		if (info->ssl_private_key_filepath)
			memcpy(vh->tls.key_path, info->ssl_private_key_filepath,
			       strlen(info->ssl_private_key_filepath) + 1);
	}
#endif

#if defined(LWS_WITH_HTTP_PROXY) && defined(LWS_ROLE_WS)
	fx = 1;
#endif
#if defined(LWS_WITH_ABSTRACT)
	abs_pcol_count = (int)LWS_ARRAY_SIZE(available_abstract_protocols) - 1;
#endif
#if defined(LWS_WITH_SECURE_STREAMS)
	sec_pcol_count = (int)LWS_ARRAY_SIZE(available_secstream_protocols) - 1;
#endif

	/*
	 * give the vhost a unified list of protocols including:
	 *
	 * - internal, async_dns if enabled (first vhost only)
	 * - internal, abstracted ones
	 * - the ones that came from plugins
	 * - his user protocols
	 */

	if (lws_fi(&vh->fic, "vh_create_pcols_oom"))
		lwsp = NULL;
	else
		lwsp = lws_zalloc(sizeof(struct lws_protocols) *
				((unsigned int)vh->count_protocols +
				   (unsigned int)abs_pcol_count +
				   (unsigned int)sec_pcol_count +
				   (unsigned int)context->plugin_protocol_count +
				   (unsigned int)fx + 1), "vh plugin table");
	if (!lwsp) {
		lwsl_err("OOM\n");
		goto bail;
	}

	/*
	 * 1: user protocols (from pprotocols or protocols)
	 */

	m = vh->count_protocols;
	if (!pcols) {
		for (n = 0; n < m; n++)
			memcpy(&lwsp[n], info->pprotocols[n], sizeof(lwsp[0]));
	} else
		memcpy(lwsp, pcols, sizeof(struct lws_protocols) * (unsigned int)m);

	/*
	 * 2: abstract protocols
	 */
#if defined(LWS_WITH_ABSTRACT)
	for (n = 0; n < abs_pcol_count; n++) {
		memcpy(&lwsp[m++], available_abstract_protocols[n],
		       sizeof(*lwsp));
		vh->count_protocols++;
	}
#endif
	/*
	 * 3: async dns protocol (first vhost only)
	 */
#if defined(LWS_WITH_SYS_ASYNC_DNS)
	if (!context->vhost_list) {
		memcpy(&lwsp[m++], &lws_async_dns_protocol,
		       sizeof(struct lws_protocols));
		vh->count_protocols++;
	}
#endif

#if defined(LWS_WITH_SECURE_STREAMS)
	for (n = 0; n < sec_pcol_count; n++) {
		memcpy(&lwsp[m++], available_secstream_protocols[n],
		       sizeof(*lwsp));
		vh->count_protocols++;
	}
#endif

	/*
	 * 3: For compatibility, all protocols enabled on vhost if only
	 * the default vhost exists.  Otherwise only vhosts who ask
	 * for a protocol get it enabled.
	 */

	if (context->options & LWS_SERVER_OPTION_EXPLICIT_VHOSTS)
		f = 0;
	(void)f;
#ifdef LWS_WITH_PLUGINS
	if (plugin) {
		while (plugin) {
			const lws_plugin_protocol_t *plpr =
				(const lws_plugin_protocol_t *)plugin->hdr;

			for (n = 0; n < plpr->count_protocols; n++) {
				/*
				 * for compatibility's sake, no pvo implies
				 * allow all protocols
				 */
				if (f || lws_vhost_protocol_options(vh,
						plpr->protocols[n].name)) {
					memcpy(&lwsp[m],
					       &plpr->protocols[n],
					       sizeof(struct lws_protocols));
					m++;
					vh->count_protocols++;
				}
			}
			plugin = plugin->list;
		}
	}
#endif

#if defined(LWS_WITH_HTTP_PROXY) && defined(LWS_ROLE_WS)
	memcpy(&lwsp[m++], &lws_ws_proxy, sizeof(*lwsp));
	vh->count_protocols++;
#endif

	vh->protocols = lwsp;
	vh->allocated_vhost_protocols = 1;

	vh->same_vh_protocol_owner = (struct lws_dll2_owner *)
			lws_zalloc(sizeof(struct lws_dll2_owner) *
				   (unsigned int)vh->count_protocols, "same vh list");
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	vh->http.mount_list = info->mounts;
#endif

#if defined(LWS_WITH_SYS_METRICS) && defined(LWS_WITH_SERVER)
	{
		char *end = buf + sizeof(buf) - 1;
		p = buf;

		p += lws_snprintf(p, lws_ptr_diff_size_t(end, p), "vh.%s", vh->name);
		if (info->iface)
			p += lws_snprintf(p, lws_ptr_diff_size_t(end, p), ".%s", info->iface);
		if (info->port && !(info->port & 0xffff))
			p += lws_snprintf(p, lws_ptr_diff_size_t(end, p), ".%u", info->port);
		p += lws_snprintf(p, lws_ptr_diff_size_t(end, p), ".rx");
		vh->mt_traffic_rx = lws_metric_create(context, 0, buf);
		p[-2] = 't';
		vh->mt_traffic_tx = lws_metric_create(context, 0, buf);
	}
#endif

#ifdef LWS_WITH_UNIX_SOCK
	if (LWS_UNIX_SOCK_ENABLED(vh)) {
		lwsl_vhost_info(vh, "Creating '%s' path \"%s\", %d protocols",
				vh->name, vh->iface, vh->count_protocols);
	} else
#endif
	{
		switch(info->port) {
		case CONTEXT_PORT_NO_LISTEN:
			strcpy(buf, "(serving disabled)");
			break;
		case CONTEXT_PORT_NO_LISTEN_SERVER:
			strcpy(buf, "(no listener)");
			break;
		default:
			lws_snprintf(buf, sizeof(buf), "port %u", info->port);
			break;
		}
		lwsl_vhost_info(vh, "Creating Vhost '%s' %s, %d protocols, IPv6 %s",
			    vh->name, buf, vh->count_protocols,
			    LWS_IPV6_ENABLED(vh) ? "on" : "off");
	}
	mounts = info->mounts;
	while (mounts) {
		(void)mount_protocols[0];
		lwsl_vhost_info(vh, "   mounting %s%s to %s",
			  mount_protocols[mounts->origin_protocol],
			  mounts->origin ? mounts->origin : "none",
			  mounts->mountpoint);

		mounts = mounts->mount_next;
	}

	vh->listen_port = info->port;

#if defined(LWS_WITH_SOCKS5)
	vh->socks_proxy_port = 0;
	vh->socks_proxy_address[0] = '\0';
#endif

#if defined(LWS_WITH_CLIENT) && defined(LWS_CLIENT_HTTP_PROXYING)
	/* either use proxy from info, or try get it from env var */
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	vh->http.http_proxy_port = 0;
	vh->http.http_proxy_address[0] = '\0';
	/* http proxy */
	if (info->http_proxy_address) {
		/* override for backwards compatibility */
		if (info->http_proxy_port)
			vh->http.http_proxy_port = info->http_proxy_port;
		lws_set_proxy(vh, info->http_proxy_address);
	} else
#endif
	{
#ifdef LWS_HAVE_GETENV
#if defined(__COVERITY__)
		p = NULL;
#else
		p = getenv("http_proxy"); /* coverity[tainted_scalar] */
		if (p) {
			lws_strncpy(buf, p, sizeof(buf));
			lws_set_proxy(vh, buf);
		}
#endif
#endif
	}
#endif
#if defined(LWS_WITH_SOCKS5)
	lws_socks5c_ads_server(vh, info);
#endif

	vh->ka_time = info->ka_time;
	vh->ka_interval = info->ka_interval;
	vh->ka_probes = info->ka_probes;

	if (vh->options & LWS_SERVER_OPTION_STS)
		lwsl_vhost_notice(vh, "   STS enabled");

#ifdef LWS_WITH_ACCESS_LOG
	if (info->log_filepath) {
		if (lws_fi(&vh->fic, "vh_create_access_log_open_fail"))
			vh->log_fd = (int)LWS_INVALID_FILE;
		else
			vh->log_fd = lws_open(info->log_filepath,
				  O_CREAT | O_APPEND | O_RDWR, 0600);
		if (vh->log_fd == (int)LWS_INVALID_FILE) {
			lwsl_vhost_err(vh, "unable to open log filepath %s",
					   info->log_filepath);
			goto bail;
		}
#ifndef WIN32
		if (context->uid != (uid_t)-1)
			if (chown(info->log_filepath, context->uid,
				  context->gid) == -1)
				lwsl_vhost_err(vh, "unable to chown log file %s",
						   info->log_filepath);
#endif
	} else
		vh->log_fd = (int)LWS_INVALID_FILE;
#endif
	if (lws_fi(&vh->fic, "vh_create_ssl_srv") ||
	    lws_context_init_server_ssl(info, vh)) {
		lwsl_vhost_err(vh, "lws_context_init_server_ssl failed");
		goto bail1;
	}
	if (lws_fi(&vh->fic, "vh_create_ssl_cli") ||
	    lws_context_init_client_ssl(info, vh)) {
		lwsl_vhost_err(vh, "lws_context_init_client_ssl failed");
		goto bail1;
	}
#if defined(LWS_WITH_SERVER)
	lws_context_lock(context, __func__);
	if (lws_fi(&vh->fic, "vh_create_srv_init"))
		n = -1;
	else
		n = _lws_vhost_init_server(info, vh);
	lws_context_unlock(context);
	if (n < 0) {
		lwsl_vhost_err(vh, "init server failed\n");
		goto bail1;
	}
#endif

#if defined(LWS_WITH_SYS_ASYNC_DNS)
	n = !!context->vhost_list;
#endif

	while (1) {
		if (!(*vh1)) {
			*vh1 = vh;
			break;
		}
		vh1 = &(*vh1)->vhost_next;
	};

#if defined(LWS_WITH_SYS_ASYNC_DNS)
	if (!n)
		lws_async_dns_init(context);
#endif

	/* for the case we are adding a vhost much later, after server init */

	if (context->protocol_init_done)
		if (lws_fi(&vh->fic, "vh_create_protocol_init") ||
		    lws_protocol_init(context)) {
			lwsl_vhost_err(vh, "lws_protocol_init failed");
			goto bail1;
		}

	return vh;

bail1:
	lws_vhost_destroy(vh);

	return NULL;

bail:
	__lws_lc_untag(vh->context, &vh->lc);
	lws_fi_destroy(&vh->fic);
	lws_free(vh);

early_bail:
	lws_fi_destroy(&info->fic);

	return NULL;
}